

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O1

bool embree::avx::DiscMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *Disc)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined4 uVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  ulong uVar10;
  undefined1 auVar11 [32];
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  Scene *pSVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar29;
  float fVar30;
  undefined1 auVar26 [16];
  float fVar31;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  float fVar47;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  RTCFilterFunctionNArguments args;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  RayQueryContext *local_1a0;
  Primitive *local_198;
  Scene *local_190;
  RTCFilterFunctionNArguments local_188;
  undefined1 local_158 [16];
  undefined1 local_148 [32];
  undefined1 local_128 [16];
  float local_118 [4];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  RTCHitN local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [32];
  
  pSVar19 = context->scene;
  pGVar7 = (pSVar19->geometries).items[Disc->sharedGeomID].ptr;
  lVar21 = *(long *)&pGVar7->field_0x58;
  _Var8 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar23 = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[0] * _Var8);
  auVar28 = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[1] * _Var8);
  auVar41 = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[2] * _Var8);
  auVar36 = *(undefined1 (*) [16])(lVar21 + (Disc->primIDs).field_0.i[3] * _Var8);
  auVar24 = vunpcklps_avx(auVar23,auVar41);
  auVar27 = vunpckhps_avx(auVar23,auVar41);
  auVar23 = vunpcklps_avx(auVar28,auVar36);
  auVar48 = vunpckhps_avx(auVar28,auVar36);
  auVar36 = vunpcklps_avx(auVar24,auVar23);
  auVar28 = vunpckhps_avx(auVar24,auVar23);
  auVar42 = vunpcklps_avx(auVar27,auVar48);
  auVar23 = vpshufd_avx(ZEXT116(Disc->numPrimitives),0);
  auVar41 = vpcmpgtd_avx(auVar23,_DAT_01ff0cf0);
  local_158 = vpshufd_avx(ZEXT416(Disc->sharedGeomID),0);
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar36 = vsubps_avx(auVar36,auVar26);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24 = vsubps_avx(auVar28,auVar24);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar42 = vsubps_avx(auVar42,auVar23);
  fVar2 = *(float *)(ray + k * 4 + 0x40);
  fVar3 = *(float *)(ray + k * 4 + 0x50);
  fVar4 = *(float *)(ray + k * 4 + 0x60);
  auVar23 = ZEXT416((uint)(fVar2 * fVar2 + fVar3 * fVar3 + fVar4 * fVar4));
  auVar28 = vshufps_avx(auVar23,auVar23,0);
  auVar23 = vrcpps_avx(auVar28);
  fVar47 = auVar23._0_4_;
  auVar44._0_4_ = fVar47 * auVar28._0_4_;
  fVar50 = auVar23._4_4_;
  auVar44._4_4_ = fVar50 * auVar28._4_4_;
  fVar51 = auVar23._8_4_;
  auVar44._8_4_ = fVar51 * auVar28._8_4_;
  fVar52 = auVar23._12_4_;
  auVar44._12_4_ = fVar52 * auVar28._12_4_;
  auVar53._8_4_ = 0x3f800000;
  auVar53._0_8_ = &DAT_3f8000003f800000;
  auVar53._12_4_ = 0x3f800000;
  auVar23 = vsubps_avx(auVar53,auVar44);
  fVar37 = auVar42._0_4_;
  fVar38 = auVar42._4_4_;
  fVar39 = auVar42._8_4_;
  fVar40 = auVar42._12_4_;
  fVar32 = auVar24._0_4_;
  fVar33 = auVar24._4_4_;
  fVar34 = auVar24._8_4_;
  fVar35 = auVar24._12_4_;
  fVar25 = auVar36._0_4_;
  fVar29 = auVar36._4_4_;
  fVar30 = auVar36._8_4_;
  fVar31 = auVar36._12_4_;
  local_128._0_4_ =
       (fVar25 * fVar2 + fVar32 * fVar3 + fVar37 * fVar4) * (fVar47 + fVar47 * auVar23._0_4_);
  local_128._4_4_ =
       (fVar29 * fVar2 + fVar33 * fVar3 + fVar38 * fVar4) * (fVar50 + fVar50 * auVar23._4_4_);
  local_128._8_4_ =
       (fVar30 * fVar2 + fVar34 * fVar3 + fVar39 * fVar4) * (fVar51 + fVar51 * auVar23._8_4_);
  local_128._12_4_ =
       (fVar31 * fVar2 + fVar35 * fVar3 + fVar40 * fVar4) * (fVar52 + fVar52 * auVar23._12_4_);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar23 = vcmpps_avx(auVar28,local_128,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar54._4_4_ = uVar1;
  auVar54._0_4_ = uVar1;
  auVar54._8_4_ = uVar1;
  auVar54._12_4_ = uVar1;
  auVar28 = vcmpps_avx(local_128,auVar54,2);
  auVar23 = vandps_avx(auVar28,auVar23);
  auVar28 = auVar41 & auVar23;
  if ((((auVar28 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar28 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar28 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar28[0xf] < '\0') {
    auVar23 = vandps_avx(auVar23,auVar41);
    auVar27 = vunpckhps_avx(auVar27,auVar48);
    auVar41._0_4_ = local_128._0_4_ * fVar2;
    auVar41._4_4_ = local_128._4_4_ * fVar2;
    auVar41._8_4_ = local_128._8_4_ * fVar2;
    auVar41._12_4_ = local_128._12_4_ * fVar2;
    auVar48._0_4_ = local_128._0_4_ * fVar3;
    auVar48._4_4_ = local_128._4_4_ * fVar3;
    auVar48._8_4_ = local_128._8_4_ * fVar3;
    auVar48._12_4_ = local_128._12_4_ * fVar3;
    auVar55._0_4_ = local_128._0_4_ * fVar4;
    auVar55._4_4_ = local_128._4_4_ * fVar4;
    auVar55._8_4_ = local_128._8_4_ * fVar4;
    auVar55._12_4_ = local_128._12_4_ * fVar4;
    auVar28 = vsubps_avx(auVar36,auVar41);
    auVar41 = vsubps_avx(auVar24,auVar48);
    auVar36 = vsubps_avx(auVar42,auVar55);
    auVar42._0_4_ =
         auVar41._0_4_ * auVar41._0_4_ + auVar36._0_4_ * auVar36._0_4_ +
         auVar28._0_4_ * auVar28._0_4_;
    auVar42._4_4_ =
         auVar41._4_4_ * auVar41._4_4_ + auVar36._4_4_ * auVar36._4_4_ +
         auVar28._4_4_ * auVar28._4_4_;
    auVar42._8_4_ =
         auVar41._8_4_ * auVar41._8_4_ + auVar36._8_4_ * auVar36._8_4_ +
         auVar28._8_4_ * auVar28._8_4_;
    auVar42._12_4_ =
         auVar41._12_4_ * auVar41._12_4_ + auVar36._12_4_ * auVar36._12_4_ +
         auVar28._12_4_ * auVar28._12_4_;
    auVar36._0_4_ = auVar27._0_4_ * auVar27._0_4_;
    auVar36._4_4_ = auVar27._4_4_ * auVar27._4_4_;
    auVar36._8_4_ = auVar27._8_4_ * auVar27._8_4_;
    auVar36._12_4_ = auVar27._12_4_ * auVar27._12_4_;
    auVar28 = vcmpps_avx(auVar42,auVar36,2);
    auVar41 = auVar23 & auVar28;
    if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar41 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar41 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar41[0xf] < '\0')
    {
      auVar28 = vandps_avx(auVar23,auVar28);
      auVar27._0_4_ = fVar25 * fVar25 + fVar32 * fVar32 + fVar37 * fVar37;
      auVar27._4_4_ = fVar29 * fVar29 + fVar33 * fVar33 + fVar38 * fVar38;
      auVar27._8_4_ = fVar30 * fVar30 + fVar34 * fVar34 + fVar39 * fVar39;
      auVar27._12_4_ = fVar31 * fVar31 + fVar35 * fVar35 + fVar40 * fVar40;
      auVar41 = vcmpps_avx(auVar27,auVar36,6);
      auVar28 = vandps_avx(auVar28,auVar41);
      iVar18 = vmovmskps_avx(auVar28);
      if (iVar18 != 0) {
        local_108._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
        local_108._8_4_ = -fVar3;
        local_108._12_4_ = -fVar3;
        local_f8._0_8_ = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
        local_f8._8_4_ = -fVar4;
        local_f8._12_4_ = -fVar4;
        auVar28 = ZEXT816(0);
        local_148 = ZEXT1632(auVar28);
        local_118[0] = -fVar2;
        local_118[1] = -fVar2;
        local_118[2] = -fVar2;
        local_118[3] = -fVar2;
        uVar20 = (ulong)(byte)iVar18;
        lVar21 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
        auVar11 = vcmpps_avx(ZEXT1632(auVar28),ZEXT1632(auVar28),0xf);
        auVar43 = ZEXT3264(auVar11);
        auVar45 = ZEXT464(0) << 0x20;
        auVar23 = vpcmpeqd_avx(auVar23,auVar23);
        auVar46 = ZEXT1664(auVar23);
        auVar49 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
        local_198 = Disc;
        local_1a0 = context;
        do {
          local_188.hit = local_e8;
          local_188.valid = (int *)&local_1b8;
          uVar10 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
            }
          }
          uVar6 = *(uint *)(local_158 + uVar10 * 4);
          pGVar7 = (pSVar19->geometries).items[uVar6].ptr;
          if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar20 = uVar20 ^ 1L << (uVar10 & 0x3f);
            bVar22 = true;
          }
          else if ((local_1a0->args->filter == (RTCFilterFunctionN)0x0) &&
                  (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            bVar22 = false;
          }
          else {
            uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
            uVar5 = *(undefined4 *)(local_148 + uVar10 * 4);
            local_b8._4_4_ = uVar5;
            local_b8._0_4_ = uVar5;
            local_b8._8_4_ = uVar5;
            local_b8._12_4_ = uVar5;
            uVar5 = *(undefined4 *)(local_148 + uVar10 * 4 + 0x10);
            local_a8._4_4_ = uVar5;
            local_a8._0_4_ = uVar5;
            local_a8._8_4_ = uVar5;
            local_a8._12_4_ = uVar5;
            *(float *)(ray + k * 4 + 0x80) = local_118[uVar10 - 4];
            local_188.context = local_1a0->user;
            local_88 = vpshufd_avx(ZEXT416(uVar6),0);
            uVar6 = (local_198->primIDs).field_0.i[uVar10];
            local_98._4_4_ = uVar6;
            local_98._0_4_ = uVar6;
            local_98._8_4_ = uVar6;
            local_98._12_4_ = uVar6;
            fVar2 = local_118[uVar10];
            uVar5 = *(undefined4 *)(local_108 + uVar10 * 4);
            local_d8._4_4_ = uVar5;
            local_d8._0_4_ = uVar5;
            local_d8._8_4_ = uVar5;
            local_d8._12_4_ = uVar5;
            uVar5 = *(undefined4 *)(local_f8 + uVar10 * 4);
            local_c8._4_4_ = uVar5;
            local_c8._0_4_ = uVar5;
            local_c8._8_4_ = uVar5;
            local_c8._12_4_ = uVar5;
            local_e8[0] = (RTCHitN)SUB41(fVar2,0);
            local_e8[1] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_e8[2] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_e8[3] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_e8[4] = (RTCHitN)SUB41(fVar2,0);
            local_e8[5] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_e8[6] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_e8[7] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_e8[8] = (RTCHitN)SUB41(fVar2,0);
            local_e8[9] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_e8[10] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_e8[0xb] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            local_e8[0xc] = (RTCHitN)SUB41(fVar2,0);
            local_e8[0xd] = (RTCHitN)(char)((uint)fVar2 >> 8);
            local_e8[0xe] = (RTCHitN)(char)((uint)fVar2 >> 0x10);
            local_e8[0xf] = (RTCHitN)(char)((uint)fVar2 >> 0x18);
            uStack_74 = (local_188.context)->instID[0];
            local_78 = uStack_74;
            uStack_70 = uStack_74;
            uStack_6c = uStack_74;
            uStack_68 = (local_188.context)->instPrimID[0];
            uStack_64 = uStack_68;
            uStack_60 = uStack_68;
            uStack_5c = uStack_68;
            local_1b8 = *(undefined8 *)(mm_lookupmask_ps + lVar21);
            uStack_1b0 = *(undefined8 *)(mm_lookupmask_ps + lVar21 + 8);
            local_188.geometryUserPtr = pGVar7->userPtr;
            local_188.N = 4;
            local_58 = auVar43._0_32_;
            local_188.ray = (RTCRayN *)ray;
            if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar23 = auVar46._0_16_;
              local_190 = pSVar19;
              (*pGVar7->occlusionFilterN)(&local_188);
              auVar49 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar23 = vpcmpeqd_avx(auVar23,auVar23);
              auVar46 = ZEXT1664(auVar23);
              auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar43 = ZEXT3264(local_58);
              pSVar19 = local_190;
            }
            auVar16._8_8_ = uStack_1b0;
            auVar16._0_8_ = local_1b8;
            auVar23 = auVar46._0_16_;
            if (auVar16 == (undefined1  [16])0x0) {
              auVar28 = vpcmpeqd_avx(auVar45._0_16_,(undefined1  [16])0x0);
              auVar23 = auVar23 ^ auVar28;
            }
            else {
              p_Var9 = local_1a0->args->filter;
              if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                 (((local_1a0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                (*p_Var9)(&local_188);
                auVar49 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
                auVar23 = vpcmpeqd_avx(auVar23,auVar23);
                auVar46 = ZEXT1664(auVar23);
                auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar43 = ZEXT3264(local_58);
              }
              auVar17._8_8_ = uStack_1b0;
              auVar17._0_8_ = local_1b8;
              auVar28 = vpcmpeqd_avx(auVar45._0_16_,auVar17);
              auVar23 = auVar46._0_16_ ^ auVar28;
              auVar28 = vblendvps_avx(auVar49._0_16_,*(undefined1 (*) [16])(local_188.ray + 0x80),
                                      auVar28);
              *(undefined1 (*) [16])(local_188.ray + 0x80) = auVar28;
            }
            auVar23 = vpslld_avx(auVar23,0x1f);
            bVar14 = (auVar23 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
            bVar15 = (auVar23 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
            bVar13 = (auVar23 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
            bVar12 = -1 < auVar23[0xf];
            bVar22 = ((bVar14 && bVar15) && bVar13) && bVar12;
            if (((bVar14 && bVar15) && bVar13) && bVar12) {
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
              uVar20 = uVar20 ^ 1L << (uVar10 & 0x3f);
            }
          }
        } while ((bVar22 != false) && (uVar20 != 0));
        return (bool)(bVar22 ^ 1);
      }
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(
          const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(shadow.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Disc.gather(v0, geom);
        const vbool<M> valid = Disc.valid();
        return DiscIntersectorK<M, K>::intersect(
          valid, ray, k, context, geom, pre, v0,
          Occluded1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }